

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O0

xmlChar * constString(xmlTextReaderPtr reader,xmlChar *string)

{
  xmlChar *dictString;
  xmlChar *string_local;
  xmlTextReaderPtr reader_local;
  
  if (string == (xmlChar *)0x0) {
    reader_local = (xmlTextReaderPtr)0x0;
  }
  else {
    reader_local = (xmlTextReaderPtr)xmlDictLookup(reader->dict,string,-1);
    if (reader_local == (xmlTextReaderPtr)0x0) {
      xmlTextReaderErrMemory(reader);
    }
  }
  return (xmlChar *)reader_local;
}

Assistant:

static const xmlChar *
constString(xmlTextReaderPtr reader, const xmlChar *string) {
    const xmlChar *dictString;

    if (string == NULL)
        return(NULL);

    dictString = xmlDictLookup(reader->dict, string, -1);
    if (dictString == NULL)
        xmlTextReaderErrMemory(reader);

    return(dictString);
}